

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_gp.cpp
# Opt level: O0

uint tlm::tlm_extension_base::register_extension(type_info *type)

{
  uint uVar1;
  type_info *in_RDI;
  tlm_extension_registry *in_stack_00000030;
  sc_type_index in_stack_00000038;
  sc_type_index local_10;
  type_info *local_8;
  
  local_8 = in_RDI;
  anon_unknown_2::tlm_extension_registry::instance();
  sc_core::sc_type_index::sc_type_index(&local_10,local_8);
  uVar1 = anon_unknown_2::tlm_extension_registry::register_extension
                    (in_stack_00000030,in_stack_00000038);
  return uVar1;
}

Assistant:

unsigned int
tlm_extension_base::register_extension(const std::type_info& type)
{
    return tlm_extension_registry::instance().register_extension(type);
}